

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O3

Error __thiscall
asmjit::RALocalAllocator::switchToAssignment
          (RALocalAllocator *this,PhysToWorkMap *dstPhysToWorkMap,WorkToPhysMap *dstWorkToPhysMap,
          ZoneBitVector *liveIn,bool dstReadOnly,bool tryMode)

{
  uint32_t *puVar1;
  byte bVar2;
  uint uVar3;
  uint32_t *puVar4;
  PhysToWorkMap *pPVar5;
  uint32_t dstPhysId;
  Error EVar6;
  int iVar7;
  uint uVar8;
  BaseRAPass *pBVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint32_t *puVar14;
  uint32_t regMask;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint32_t group;
  RAAssignment *this_00;
  ulong uVar19;
  bool bVar20;
  uint local_d4;
  anon_union_4_2_ebeb14a8_for_RARegCount_0 local_78;
  uint local_74;
  int local_70;
  uint local_6c;
  RAWorkRegs *local_68;
  WorkToPhysMap *local_60;
  PhysToWorkMap *local_58;
  uint32_t *local_50 [4];
  
  local_50[2] = (uint32_t *)0x0;
  local_50[3] = (uint32_t *)0x0;
  local_50[0] = (uint32_t *)0x0;
  local_50[1] = (uint32_t *)0x0;
  pBVar9 = this->_pass;
  bVar2 = (pBVar9->_physRegCount).field_0._regs[0];
  uVar12 = (uint)(pBVar9->_physRegCount).field_0._regs[1] + (uint)bVar2;
  if (uVar12 < 0x100) {
    uVar18 = (pBVar9->_physRegCount).field_0._regs[2] + uVar12;
    if (uVar18 < 0x100) {
      this_00 = &this->_curAssignment;
      local_68 = &pBVar9->_workRegs;
      local_78._packed = uVar18 * 0x1000000 | uVar12 * 0x10000 | (uint)bVar2 << 8;
      local_74 = (pBVar9->_physRegCount).field_0._packed;
      local_70 = (local_74 >> 0x18) + uVar18;
      uVar12 = (pBVar9->_workRegs).super_ZoneVectorBase._size;
      lVar11 = 0;
      do {
        *(uint32_t **)((long)local_50 + lVar11) =
             dstPhysToWorkMap->workIds + (local_78._packed >> ((byte)lVar11 & 0x1f) & 0xff);
        lVar11 = lVar11 + 8;
      } while (lVar11 != 0x20);
      if (!tryMode) {
        lVar11 = 0;
        local_6c = uVar12;
        local_60 = dstWorkToPhysMap;
        local_58 = dstPhysToWorkMap;
        do {
          uVar18 = (((this->_curAssignment)._physToWorkMap)->assigned)._masks[lVar11];
          group = (uint32_t)lVar11;
          if (uVar18 != 0) {
            do {
              uVar16 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              uVar17 = 1 << ((byte)uVar16 & 0x1f);
              uVar3 = (this->_curAssignment)._physToWorkIds[lVar11][uVar16];
              uVar19 = (ulong)uVar3;
              if (uVar19 == 0xffffffff) goto LAB_0011b9ab;
              if (liveIn->_size <= uVar3) goto LAB_0011b9b0;
              if ((liveIn->_data[uVar3 >> 6] >> (uVar19 & 0x3f) & 1) == 0) {
LAB_0011b45d:
                RAAssignment::unassign(this_00,group,uVar3,uVar16);
              }
              else {
                if (uVar12 <= uVar3) goto LAB_0011b9c4;
                if (dstWorkToPhysMap[uVar19].physIds[0] == 0xff) {
                  if ((((((this->_curAssignment)._physToWorkMap)->dirty)._masks[lVar11] & uVar17) !=
                       0) && (EVar6 = onSaveReg(this,group,uVar3,uVar16), EVar6 != 0)) {
                    return EVar6;
                  }
                  goto LAB_0011b45d;
                }
              }
              bVar20 = uVar17 != uVar18;
              uVar18 = uVar18 ^ 1 << (uVar16 & 0x1f);
            } while (bVar20);
          }
          uVar18 = (dstPhysToWorkMap->assigned)._masks[lVar11];
          if (uVar18 == 0) {
            local_d4 = 0;
          }
          else {
            puVar1 = (dstPhysToWorkMap->dirty)._masks + lVar11;
            local_d4 = 0;
            iVar7 = -1;
            do {
              iVar7 = iVar7 + 1;
              if (iVar7 == 2) {
                return 3;
              }
              puVar4 = local_50[lVar11];
              uVar16 = uVar18;
              do {
                uVar3 = 0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                  }
                }
                uVar15 = 1 << ((byte)uVar3 & 0x1f);
                uVar17 = *(uint *)((long)puVar4 + (ulong)(uVar3 * 4));
                uVar19 = (ulong)uVar17;
                if (uVar19 == 0xffffffff) {
                  switchToAssignment();
LAB_0011b997:
                  switchToAssignment();
LAB_0011b99c:
                  switchToAssignment();
LAB_0011b9a1:
                  switchToAssignment();
LAB_0011b9a6:
                  switchToAssignment();
                  goto LAB_0011b9ab;
                }
                uVar8 = *(uint *)((long)(this->_curAssignment)._physToWorkIds[lVar11] +
                                 (ulong)(uVar3 * 4));
                if (uVar8 == 0xffffffff) {
LAB_0011b687:
                  if ((this->_curAssignment)._layout.workCount <= uVar17) goto LAB_0011b9a1;
                  bVar2 = (this->_curAssignment)._workToPhysMap[uVar19].physIds[0];
                  if (bVar2 == 0xff) {
                    if (uVar17 < liveIn->_size) {
                      uVar8 = uVar15;
                      if ((liveIn->_data[uVar17 >> 6] >> (uVar19 & 0x3f) & 1) == 0) {
                        uVar8 = 0;
                      }
                      local_d4 = local_d4 | uVar8;
                      uVar18 = uVar18 & ~uVar15;
                      goto LAB_0011b7ea;
                    }
                    goto LAB_0011b9ba;
                  }
                  if (uVar3 != bVar2) {
                    RAAssignment::reassign(this_00,group,uVar17,uVar3,(uint)bVar2);
                    EVar6 = (*(this->_pass->super_FuncPass).super_Pass._vptr_Pass[9])
                                      (this->_pass,(ulong)uVar17,(ulong)uVar3,(ulong)(uint)bVar2);
                    if (EVar6 != 0) {
                      return EVar6;
                    }
                  }
LAB_0011b6fb:
                  uVar8 = *puVar1;
                  pPVar5 = (this->_curAssignment)._physToWorkMap;
                  uVar13 = (pPVar5->dirty)._masks[lVar11];
                  if (((uVar13 ^ uVar8) & uVar15) == 0) {
LAB_0011b7a9:
                    if (*(int *)((long)puVar4 + (ulong)(uVar3 << 2)) !=
                        *(int *)((long)(this->_curAssignment)._physToWorkIds[lVar11] +
                                (ulong)(uVar3 << 2))) goto LAB_0011b997;
                    if (((*puVar1 & uVar15) != 0) ==
                        (((((this->_curAssignment)._physToWorkMap)->dirty)._masks[lVar11] & uVar15)
                        != 0)) {
                      uVar18 = uVar18 & ~uVar15;
                      iVar7 = -1;
                      goto LAB_0011b7ea;
                    }
                    goto LAB_0011b99c;
                  }
                  if ((uVar8 & uVar15) != 0) {
                    if ((uVar13 & uVar15) == 0) {
                      puVar14 = (pPVar5->dirty)._masks + lVar11;
                      uVar8 = uVar13;
                      goto LAB_0011b7a5;
                    }
                    goto LAB_0011b9a6;
                  }
                  if ((uVar13 & uVar15) != 0) {
                    puVar14 = puVar1;
                    if (dstReadOnly) {
                      EVar6 = onSaveReg(this,group,uVar17,uVar3);
                      if (EVar6 != 0) {
                        return EVar6;
                      }
                    }
                    else {
LAB_0011b7a5:
                      *puVar14 = uVar8 | uVar15;
                    }
                    goto LAB_0011b7a9;
                  }
                  goto LAB_0011b9bf;
                }
                if (uVar8 == uVar17) goto LAB_0011b6fb;
                if (0 < iVar7) {
                  if ((this->_curAssignment)._layout.workCount <= uVar17) goto LAB_0011b9b5;
                  bVar2 = (this->_curAssignment)._workToPhysMap[uVar19].physIds[0];
                  if (bVar2 != 0xff) {
                    if ((this->_archTraits->_isaFlags[lVar11] & 1) == 0) {
                      pPVar5 = (this->_curAssignment)._physToWorkMap;
                      if (((pPVar5->dirty)._masks[lVar11] & uVar15) == 0) {
                        RAAssignment::unassign(this_00,group,uVar8,uVar3);
                      }
                      else {
                        pBVar9 = this->_pass;
                        uVar10 = ~(pPVar5->assigned)._masks[lVar11] &
                                 (pBVar9->_availableRegs)._masks[lVar11];
                        uVar13 = ~(dstPhysToWorkMap->assigned)._masks[lVar11] & uVar10;
                        if ((uVar13 == 0) && (uVar13 = uVar10, uVar10 == 0)) {
                          EVar6 = onSaveReg(this,group,uVar8,uVar3);
                          if (EVar6 != 0) {
                            return EVar6;
                          }
                          RAAssignment::unassign(this_00,group,uVar8,uVar3);
                          iVar7 = -1;
                          goto LAB_0011b687;
                        }
                        dstPhysId = 0;
                        if (uVar13 != 0) {
                          for (; (uVar13 >> dstPhysId & 1) == 0; dstPhysId = dstPhysId + 1) {
                          }
                        }
                        if (dstPhysId != uVar3) {
                          RAAssignment::reassign(this_00,group,uVar8,dstPhysId,uVar3);
                          EVar6 = (*(this->_pass->super_FuncPass).super_Pass._vptr_Pass[9])
                                            (this->_pass,(ulong)uVar8,(ulong)dstPhysId,(ulong)uVar3)
                          ;
                          if (EVar6 != 0) {
                            return EVar6;
                          }
                          pBVar9 = this->_pass;
                        }
                        puVar14 = (pBVar9->_clobberedRegs)._masks + lVar11;
                        *puVar14 = *puVar14 | 1 << ((byte)dstPhysId & 0x1f);
                      }
                      iVar7 = -1;
                      goto LAB_0011b687;
                    }
                    RAAssignment::swap(this_00,group,uVar8,uVar3,uVar17,(uint)bVar2);
                    EVar6 = (*(this->_pass->super_FuncPass).super_Pass._vptr_Pass[10])
                                      (this->_pass,(ulong)uVar8,(ulong)uVar3,uVar19,(ulong)bVar2);
                    if (EVar6 != 0) {
                      return EVar6;
                    }
                    goto LAB_0011b6fb;
                  }
                }
LAB_0011b7ea:
                bVar20 = uVar15 != uVar16;
                uVar16 = uVar16 ^ 1 << (uVar3 & 0x1f);
              } while (bVar20);
            } while (uVar18 != 0);
          }
          if (local_d4 != 0) {
            do {
              uVar18 = 0;
              if (local_d4 != 0) {
                for (; (local_d4 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                }
              }
              uVar16 = 1 << ((byte)uVar18 & 0x1f);
              if (((((this->_curAssignment)._physToWorkMap)->assigned)._masks[lVar11] >>
                   (uVar18 & 0x1f) & 1) != 0) goto LAB_0011b9e2;
              uVar3 = local_50[lVar11][uVar18];
              if (liveIn->_size <= uVar3) goto LAB_0011b9c9;
              if ((liveIn->_data[uVar3 >> 6] >> ((ulong)uVar3 & 0x3f) & 1) == 0) goto LAB_0011b9ce;
              RAAssignment::assign(this_00,group,uVar3,uVar18,0);
              EVar6 = (*(this->_pass->super_FuncPass).super_Pass._vptr_Pass[0xb])
                                (this->_pass,(ulong)uVar3,(ulong)uVar18);
              if (EVar6 != 0) {
                return EVar6;
              }
              pPVar5 = (this->_curAssignment)._physToWorkMap;
              uVar3 = (pPVar5->dirty)._masks[lVar11];
              if (((dstPhysToWorkMap->dirty)._masks[lVar11] & uVar16) == 0) {
                if ((uVar3 & uVar16) != 0) goto LAB_0011b9d3;
              }
              else {
                (pPVar5->dirty)._masks[lVar11] = uVar3 | uVar16;
                if (((dstPhysToWorkMap->dirty)._masks[lVar11] & uVar16) == 0) goto LAB_0011b9d3;
              }
              bVar20 = uVar16 != local_d4;
              local_d4 = local_d4 ^ 1 << (uVar18 & 0x1f);
            } while (bVar20);
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != 4);
        bVar20 = RAAssignment::equals((RAAssignment *)&local_78,this_00);
        if (!bVar20) {
          switchToAssignment();
          return 3;
        }
      }
      return 0;
    }
    goto LAB_0011b9dd;
  }
  goto LAB_0011b9d8;
LAB_0011b9ab:
  switchToAssignment();
LAB_0011b9b0:
  switchToAssignment();
LAB_0011b9b5:
  switchToAssignment();
LAB_0011b9ba:
  switchToAssignment();
LAB_0011b9bf:
  switchToAssignment();
LAB_0011b9c4:
  switchToAssignment();
LAB_0011b9c9:
  switchToAssignment();
LAB_0011b9ce:
  switchToAssignment();
LAB_0011b9d3:
  switchToAssignment();
LAB_0011b9d8:
  switchToAssignment();
LAB_0011b9dd:
  switchToAssignment();
LAB_0011b9e2:
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O3/_deps/asmjit-src/src/asmjit/core/ralocal.cpp"
             ,0x159,"tryMode == true");
}

Assistant:

Error RALocalAllocator::switchToAssignment(
  PhysToWorkMap* dstPhysToWorkMap,
  WorkToPhysMap* dstWorkToPhysMap,
  const ZoneBitVector& liveIn,
  bool dstReadOnly,
  bool tryMode) noexcept {

  RAAssignment dst;
  RAAssignment& cur = _curAssignment;

  dst.initLayout(_pass->_physRegCount, _pass->workRegs());
  dst.initMaps(dstPhysToWorkMap, dstWorkToPhysMap);

  if (tryMode)
    return kErrorOk;

  for (uint32_t group = 0; group < BaseReg::kGroupVirt; group++) {
    // ------------------------------------------------------------------------
    // STEP 1:
    //   - KILL all registers that are not live at `dst`,
    //   - SPILL all registers that are not assigned at `dst`.
    // ------------------------------------------------------------------------

    if (!tryMode) {
      Support::BitWordIterator<uint32_t> it(cur.assigned(group));
      while (it.hasNext()) {
        uint32_t physId = it.next();
        uint32_t workId = cur.physToWorkId(group, physId);

        // Must be true as we iterate over assigned registers.
        ASMJIT_ASSERT(workId != RAAssignment::kWorkNone);

        // KILL if it's not live on entry.
        if (!liveIn.bitAt(workId)) {
          onKillReg(group, workId, physId);
          continue;
        }

        // SPILL if it's not assigned on entry.
        uint32_t altId = dst.workToPhysId(group, workId);
        if (altId == RAAssignment::kPhysNone) {
          ASMJIT_PROPAGATE(onSpillReg(group, workId, physId));
        }
      }
    }

    // ------------------------------------------------------------------------
    // STEP 2:
    //   - MOVE and SWAP registers from their current assignments into their
    //     DST assignments.
    //   - Build `willLoadRegs` mask of registers scheduled for `onLoadReg()`.
    // ------------------------------------------------------------------------

    // Current run-id (1 means more aggressive decisions).
    int32_t runId = -1;
    // Remaining registers scheduled for `onLoadReg()`.
    uint32_t willLoadRegs = 0;
    // Remaining registers to be allocated in this loop.
    uint32_t affectedRegs = dst.assigned(group);

    while (affectedRegs) {
      if (++runId == 2) {
        if (!tryMode)
          return DebugUtils::errored(kErrorInvalidState);

        // Stop in `tryMode` if we haven't done anything in past two rounds.
        break;
      }

      Support::BitWordIterator<uint32_t> it(affectedRegs);
      while (it.hasNext()) {
        uint32_t physId = it.next();
        uint32_t physMask = Support::bitMask(physId);

        uint32_t curWorkId = cur.physToWorkId(group, physId);
        uint32_t dstWorkId = dst.physToWorkId(group, physId);

        // The register must have assigned `dstWorkId` as we only iterate over assigned regs.
        ASMJIT_ASSERT(dstWorkId != RAAssignment::kWorkNone);

        if (curWorkId != RAAssignment::kWorkNone) {
          // Both assigned.
          if (curWorkId != dstWorkId) {
            // Wait a bit if this is the first run, we may avoid this if `curWorkId` moves out.
            if (runId <= 0)
              continue;

            uint32_t altPhysId = cur.workToPhysId(group, dstWorkId);
            if (altPhysId == RAAssignment::kPhysNone)
              continue;

            // Reset as we will do some changes to the current assignment.
            runId = -1;

            if (_archTraits->hasSwap(group)) {
              ASMJIT_PROPAGATE(onSwapReg(group, curWorkId, physId, dstWorkId, altPhysId));
            }
            else {
              // SPILL the reg if it's not dirty in DST, otherwise try to MOVE.
              if (!cur.isPhysDirty(group, physId)) {
                ASMJIT_PROPAGATE(onKillReg(group, curWorkId, physId));
              }
              else {
                uint32_t allocableRegs = _pass->_availableRegs[group] & ~cur.assigned(group);

                // If possible don't conflict with assigned regs at DST.
                if (allocableRegs & ~dst.assigned(group))
                  allocableRegs &= ~dst.assigned(group);

                if (allocableRegs) {
                  // MOVE is possible, thus preferred.
                  uint32_t tmpPhysId = Support::ctz(allocableRegs);

                  ASMJIT_PROPAGATE(onMoveReg(group, curWorkId, tmpPhysId, physId));
                  _pass->_clobberedRegs[group] |= Support::bitMask(tmpPhysId);
                }
                else {
                  // MOVE is impossible, must SPILL.
                  ASMJIT_PROPAGATE(onSpillReg(group, curWorkId, physId));
                }
              }

              goto Cleared;
            }
          }
        }
        else {
Cleared:
          // DST assigned, CUR unassigned.
          uint32_t altPhysId = cur.workToPhysId(group, dstWorkId);
          if (altPhysId == RAAssignment::kPhysNone) {
            if (liveIn.bitAt(dstWorkId))
              willLoadRegs |= physMask; // Scheduled for `onLoadReg()`.
            affectedRegs &= ~physMask;  // Unaffected from now.
            continue;
          }
          ASMJIT_PROPAGATE(onMoveReg(group, dstWorkId, physId, altPhysId));
        }

        // Both DST and CUR assigned to the same reg or CUR just moved to DST.
        if ((dst.dirty(group) & physMask) != (cur.dirty(group) & physMask)) {
          if ((dst.dirty(group) & physMask) == 0) {
            // CUR dirty, DST not dirty (the assert is just to visualize the condition).
            ASMJIT_ASSERT(!dst.isPhysDirty(group, physId) && cur.isPhysDirty(group, physId));

            // If `dstReadOnly` is true it means that that block was already
            // processed and we cannot change from CLEAN to DIRTY. In that case
            // the register has to be saved as it cannot enter the block DIRTY.
            if (dstReadOnly)
              ASMJIT_PROPAGATE(onSaveReg(group, dstWorkId, physId));
            else
              dst.makeDirty(group, dstWorkId, physId);
          }
          else {
            // DST dirty, CUR not dirty (the assert is just to visualize the condition).
            ASMJIT_ASSERT(dst.isPhysDirty(group, physId) && !cur.isPhysDirty(group, physId));

            cur.makeDirty(group, dstWorkId, physId);
          }
        }

        // Must match now...
        ASMJIT_ASSERT(dst.physToWorkId(group, physId) == cur.physToWorkId(group, physId));
        ASMJIT_ASSERT(dst.isPhysDirty(group, physId) == cur.isPhysDirty(group, physId));

        runId = -1;
        affectedRegs &= ~physMask;
      }
    }

    // ------------------------------------------------------------------------
    // STEP 3:
    //   - Load registers specified by `willLoadRegs`.
    // ------------------------------------------------------------------------

    {
      Support::BitWordIterator<uint32_t> it(willLoadRegs);
      while (it.hasNext()) {
        uint32_t physId = it.next();

        if (!cur.isPhysAssigned(group, physId)) {
          uint32_t workId = dst.physToWorkId(group, physId);

          // The algorithm is broken if it tries to load a register that is not in LIVE-IN.
          ASMJIT_ASSERT(liveIn.bitAt(workId) == true);

          ASMJIT_PROPAGATE(onLoadReg(group, workId, physId));
          if (dst.isPhysDirty(group, physId))
            cur.makeDirty(group, workId, physId);
          ASMJIT_ASSERT(dst.isPhysDirty(group, physId) == cur.isPhysDirty(group, physId));
        }
        else {
          // Not possible otherwise.
          ASMJIT_ASSERT(tryMode == true);
        }
      }
    }
  }

  if (!tryMode) {
    // Hre is a code that dumps the conflicting part if something fails here:
    //   if (!dst.equals(cur)) {
    //     uint32_t physTotal = dst._layout.physTotal;
    //     uint32_t workCount = dst._layout.workCount;
    //
    //     for (uint32_t physId = 0; physId < physTotal; physId++) {
    //       uint32_t dstWorkId = dst._physToWorkMap->workIds[physId];
    //       uint32_t curWorkId = cur._physToWorkMap->workIds[physId];
    //       if (dstWorkId != curWorkId)
    //         fprintf(stderr, "[PhysIdWork] PhysId=%u WorkId[DST(%u) != CUR(%u)]\n", physId, dstWorkId, curWorkId);
    //     }
    //
    //     for (uint32_t workId = 0; workId < workCount; workId++) {
    //       uint32_t dstPhysId = dst._workToPhysMap->physIds[workId];
    //       uint32_t curPhysId = cur._workToPhysMap->physIds[workId];
    //       if (dstPhysId != curPhysId)
    //         fprintf(stderr, "[WorkToPhys] WorkId=%u PhysId[DST(%u) != CUR(%u)]\n", workId, dstPhysId, curPhysId);
    //     }
    //   }
    ASMJIT_ASSERT(dst.equals(cur));
  }

  return kErrorOk;
}